

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExtraLogging.cpp
# Opt level: O0

int __thiscall RenX_ExtraLoggingPlugin::think(RenX_ExtraLoggingPlugin *this)

{
  bool bVar1;
  tm *ptVar2;
  char *__ptr;
  size_type __n;
  undefined1 local_40 [8];
  string line;
  time_t tStack_18;
  int currentDay;
  time_t current_time;
  RenX_ExtraLoggingPlugin *this_local;
  
  if ((this->file != (FILE *)0x0) &&
     (current_time = (time_t)this,
     bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                       (&this->newDayFmt), !bVar1)) {
    tStack_18 = time((time_t *)0x0);
    ptVar2 = localtime(&stack0xffffffffffffffe8);
    line.field_2._12_4_ = ptVar2->tm_yday;
    if (line.field_2._12_4_ != this->day) {
      this->day = line.field_2._12_4_;
      std::__cxx11::string::string((string *)local_40,&this->newDayFmt);
      RenX::processTags((string *)local_40,(Server *)0x0,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                        (BuildingInfo *)0x0);
      __ptr = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
      __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
      fwrite(__ptr,1,__n,(FILE *)this->file);
      fputs("\r\n",(FILE *)this->file);
      std::__cxx11::string::~string((string *)local_40);
    }
  }
  return 0;
}

Assistant:

int RenX_ExtraLoggingPlugin::think() {
	if (RenX_ExtraLoggingPlugin::file != nullptr && !RenX_ExtraLoggingPlugin::newDayFmt.empty()) {
		time_t current_time = time(nullptr);
		int currentDay = localtime(&current_time)->tm_yday;
		if (currentDay != RenX_ExtraLoggingPlugin::day)
		{
			RenX_ExtraLoggingPlugin::day = currentDay;
			std::string line = RenX_ExtraLoggingPlugin::newDayFmt;
			RenX::processTags(line);
			fwrite(line.data(), sizeof(char), line.size(), file);
			fputs("\r\n", file);
		}
	}
	return 0;
}